

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

void __thiscall QLayoutPrivate::QLayoutPrivate(QLayoutPrivate *this)

{
  QRect *in_RDI;
  
  QObjectPrivate::QObjectPrivate((QObjectPrivate *)in_RDI,QObjectPrivateVersion);
  *(undefined ***)in_RDI = &PTR__QLayoutPrivate_00d07960;
  in_RDI[7].x2.m_i = -1;
  in_RDI[7].y2.m_i = -1;
  in_RDI[8].x1.m_i = -1;
  in_RDI[8].y1.m_i = -1;
  in_RDI[8].x2.m_i = -1;
  *(byte *)&in_RDI[8].y2.m_i = (byte)in_RDI[8].y2.m_i & 0xfe;
  *(byte *)&in_RDI[8].y2.m_i = (byte)in_RDI[8].y2.m_i & 0xfd | 2;
  *(byte *)&in_RDI[8].y2.m_i = (byte)in_RDI[8].y2.m_i & 0xfb | 4;
  *(byte *)&in_RDI[8].y2.m_i = (byte)in_RDI[8].y2.m_i & 0xf7;
  in_RDI[9].x1.m_i = 0;
  QRect::QRect(in_RDI);
  in_RDI[10].x2 = 0;
  in_RDI[10].y2 = 0;
  return;
}

Assistant:

QLayoutPrivate::QLayoutPrivate()
    : QObjectPrivate(), insideSpacing(-1), userLeftMargin(-1), userTopMargin(-1), userRightMargin(-1),
      userBottomMargin(-1), topLevel(false), enabled(true), activated(true), autoNewChild(false),
      constraint(QLayout::SetDefaultConstraint), menubar(nullptr)
{
}